

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

Rpo_TtStore_t * Abc_TruthStoreAlloc(int nVars,int nFuncs)

{
  Rpo_TtStore_t *pRVar1;
  word **ppwVar2;
  int local_20;
  int local_1c;
  int i;
  Rpo_TtStore_t *p;
  int nFuncs_local;
  int nVars_local;
  
  pRVar1 = (Rpo_TtStore_t *)malloc(0x18);
  pRVar1->nVars = nVars;
  if (nVars < 7) {
    local_20 = 1;
  }
  else {
    local_20 = 1 << ((char)nVars - 6U & 0x1f);
  }
  pRVar1->nWords = local_20;
  pRVar1->nFuncs = nFuncs;
  ppwVar2 = (word **)malloc(((long)pRVar1->nWords * 8 + 8) * (long)pRVar1->nFuncs);
  pRVar1->pFuncs = ppwVar2;
  *pRVar1->pFuncs = (word *)(pRVar1->pFuncs + pRVar1->nFuncs);
  memset(*pRVar1->pFuncs,0,(long)pRVar1->nWords * 8 * (long)pRVar1->nFuncs);
  for (local_1c = 1; local_1c < pRVar1->nFuncs; local_1c = local_1c + 1) {
    pRVar1->pFuncs[local_1c] = pRVar1->pFuncs[local_1c + -1] + pRVar1->nWords;
  }
  return pRVar1;
}

Assistant:

Abc_TtStore_t * Abc_TruthStoreAlloc( int nVars, int nFuncs )
{
    Abc_TtStore_t * p;
    int i;
    p = (Abc_TtStore_t *)malloc( sizeof(Abc_TtStore_t) );
    p->nVars  =  nVars;
    p->nWords = (nVars < 7) ? 1 : (1 << (nVars-6));
    p->nFuncs =  nFuncs;
    // alloc storage for 'nFuncs' truth tables as one chunk of memory
    p->pFuncs = (word **)malloc( (sizeof(word *) + sizeof(word) * p->nWords) * p->nFuncs );
    // assign and clean the truth table storage
    p->pFuncs[0] = (word *)(p->pFuncs + p->nFuncs);
    memset( p->pFuncs[0], 0, sizeof(word) * p->nWords * p->nFuncs );
    // split it up into individual truth tables
    for ( i = 1; i < p->nFuncs; i++ )
        p->pFuncs[i] = p->pFuncs[i-1] + p->nWords;
    return p;
}